

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RigidBody.cpp
# Opt level: O2

void __thiscall OpenMD::RigidBody::setA(RigidBody *this,RotMat3x3d *a,int snapshotNo)

{
  SnapshotManager *pSVar1;
  pointer ppAVar2;
  Atom *pAVar3;
  bool bVar4;
  int iVar5;
  undefined4 extraout_var;
  uint uVar6;
  ulong uVar7;
  SquareMatrix3<double> local_c0;
  SquareMatrix3<double> local_78;
  
  pSVar1 = (this->super_StuntDouble).snapshotMan_;
  iVar5 = (*pSVar1->_vptr_SnapshotManager[4])(pSVar1,(ulong)(uint)snapshotNo);
  RectMatrix<double,_3U,_3U>::operator=
            ((RectMatrix<double,_3U,_3U> *)
             ((long)(this->super_StuntDouble).localIndex_ * 0x48 +
             *(long *)(CONCAT44(extraout_var,iVar5) + 0x48 + (this->super_StuntDouble).storage_)),
             (RectMatrix<double,_3U,_3U> *)a);
  uVar6 = 0;
  while( true ) {
    uVar7 = (ulong)uVar6;
    ppAVar2 = (this->atoms_).super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
    if ((ulong)((long)(this->atoms_).
                      super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>._M_impl.
                      super__Vector_impl_data._M_finish - (long)ppAVar2 >> 3) <= uVar7) break;
    bVar4 = Atom::isDirectional(ppAVar2[uVar7]);
    if (bVar4) {
      pAVar3 = (this->atoms_).super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>.
               _M_impl.super__Vector_impl_data._M_start[uVar7];
      SquareMatrix3<double>::transpose
                (&local_c0,
                 (this->refOrients_).
                 super__Vector_base<OpenMD::SquareMatrix3<double>,_std::allocator<OpenMD::SquareMatrix3<double>_>_>
                 ._M_impl.super__Vector_impl_data._M_start + uVar7);
      operator*(&local_78,&local_c0,a);
      (*(pAVar3->super_StuntDouble)._vptr_StuntDouble[4])(pAVar3,&local_78,(ulong)(uint)snapshotNo);
    }
    uVar6 = uVar6 + 1;
  }
  return;
}

Assistant:

void RigidBody::setA(const RotMat3x3d& a, int snapshotNo) {
    ((snapshotMan_->getSnapshot(snapshotNo))->*storage_).aMat[localIndex_] = a;

    for (unsigned int i = 0; i < atoms_.size(); ++i) {
      if (atoms_[i]->isDirectional()) {
        atoms_[i]->setA(refOrients_[i].transpose() * a, snapshotNo);
      }
    }
  }